

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall fmt::v7::format_int::format_signed<long>(format_int *this,long value)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_or_64_or_128_t<long> abs_value;
  char *pcVar4;
  
  uVar2 = -value;
  if (0 < value) {
    uVar2 = value;
  }
  pcVar4 = this->buffer_ + 0x15;
  uVar3 = uVar2;
  if (99 < uVar2) {
    do {
      uVar3 = uVar2 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)(detail::basic_data<void>::digits + (uVar2 % 100) * 2);
      pcVar4 = pcVar4 + -2;
      bVar1 = 9999 < uVar2;
      uVar2 = uVar3;
    } while (bVar1);
  }
  if (uVar3 < 10) {
    pcVar4[-1] = (byte)uVar3 | 0x30;
    pcVar4 = pcVar4 + -1;
  }
  else {
    *(undefined2 *)(pcVar4 + -2) = *(undefined2 *)(detail::basic_data<void>::digits + uVar3 * 2);
    pcVar4 = pcVar4 + -2;
  }
  if (value < 0) {
    pcVar4[-1] = '-';
    pcVar4 = pcVar4 + -1;
  }
  return pcVar4;
}

Assistant:

char* format_signed(Int value) {
    auto abs_value = static_cast<detail::uint32_or_64_or_128_t<Int>>(value);
    bool negative = value < 0;
    if (negative) abs_value = 0 - abs_value;
    auto begin = format_unsigned(abs_value);
    if (negative) *--begin = '-';
    return begin;
  }